

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.c
# Opt level: O0

void redraw_frame(void)

{
  int local_5c;
  int local_4c;
  int local_3c;
  int local_2c;
  int local_1c;
  gamewin *local_10;
  gamewin *gw;
  
  if ((ui_flags.draw_frame != '\0') && (ui_flags.ingame != '\0')) {
    draw_frame();
    wnoutrefresh(basewin);
    if (mapwin == (WINDOW_conflict *)0x0) {
      local_1c = -1;
    }
    else {
      local_1c = mapwin->_maxy + 1;
    }
    wtouchln(mapwin,0,local_1c,1);
    if (msgwin == (WINDOW_conflict *)0x0) {
      local_2c = -1;
    }
    else {
      local_2c = msgwin->_maxy + 1;
    }
    wtouchln(msgwin,0,local_2c,1);
    wnoutrefresh(mapwin);
    wnoutrefresh(msgwin);
    if (statuswin != (WINDOW_conflict *)0x0) {
      if (statuswin == (WINDOW_conflict *)0x0) {
        local_3c = -1;
      }
      else {
        local_3c = statuswin->_maxy + 1;
      }
      wtouchln(statuswin,0,local_3c,1);
      wnoutrefresh(statuswin);
    }
    if (sidebar != (WINDOW_conflict *)0x0) {
      draw_sidebar_divider();
      if (sidebar == (WINDOW_conflict *)0x0) {
        local_4c = -1;
      }
      else {
        local_4c = sidebar->_maxy + 1;
      }
      wtouchln(sidebar,0,local_4c,1);
      wnoutrefresh(sidebar);
    }
    for (local_10 = firstgw; local_10 != (gamewin *)0x0; local_10 = local_10->next) {
      if (local_10->win == (WINDOW_conflict *)0x0) {
        local_5c = -1;
      }
      else {
        local_5c = local_10->win->_maxy + 1;
      }
      wtouchln(local_10->win,0,local_5c,1);
      wnoutrefresh(local_10->win);
    }
  }
  return;
}

Assistant:

void redraw_frame(void)
{
    struct gamewin *gw;

    if (!ui_flags.draw_frame || !ui_flags.ingame)
	return;

    draw_frame();
    wnoutrefresh(basewin);

    /* The order of the following is based on redraw_game_windows(). */
    touchwin(mapwin);
    touchwin(msgwin);
    wnoutrefresh(mapwin);
    wnoutrefresh(msgwin);
    if (statuswin) {
	touchwin(statuswin);
	wnoutrefresh(statuswin);
    }
    if (sidebar) {
	draw_sidebar_divider();
	touchwin(sidebar);
	wnoutrefresh(sidebar);
    }

    for (gw = firstgw; gw; gw = gw->next) {
	touchwin(gw->win);
	wnoutrefresh(gw->win);
    }
}